

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O2

int lws_frag_start(lws *wsi,int hdr_token_idx)

{
  uint16_t *puVar1;
  byte bVar2;
  uint uVar3;
  allocated_headers *paVar4;
  ulong uVar5;
  lws_fragments *plVar6;
  lws *wsi_00;
  byte bVar7;
  int iVar8;
  byte bVar9;
  
  paVar4 = (wsi->http).ah;
  if (paVar4 == (allocated_headers *)0x0) {
    _lws_log(4,"%s: no ah\n","lws_frag_start");
    iVar8 = 1;
  }
  else {
    uVar5 = (ulong)(uint)hdr_token_idx;
    paVar4->hdr_token_idx = -1;
    _lws_log(0x40,"%s: token %d ah->pos = %d, ah->nfrag = %d\n","lws_frag_start",uVar5,
             (ulong)paVar4->pos,(ulong)paVar4->nfrag);
    if (hdr_token_idx == 0) {
      iVar8 = 1;
      _lws_log(1,"%s: zero hdr_token_idx\n","lws_frag_start");
    }
    else {
      bVar7 = paVar4->nfrag;
      if (bVar7 < 0x5f) {
        if ((((hdr_token_idx - 0x23U < 0x33) &&
             ((0x400000000000fU >> ((ulong)(hdr_token_idx - 0x23U) & 0x3f) & 1) != 0)) &&
            ((ulong)paVar4->frag_index[uVar5] != 0)) &&
           ((paVar4->frags[paVar4->frag_index[uVar5]].flags & 1) == 0)) {
          wsi_00 = lws_get_network_wsi(wsi);
          iVar8 = 1;
          lws_h2_goaway(wsi_00,1,"Duplicated pseudoheader");
        }
        else {
          if (bVar7 == 0) {
            paVar4->nfrag = '\x01';
            bVar7 = 1;
          }
          uVar3 = paVar4->pos;
          paVar4->frags[bVar7].offset = uVar3;
          plVar6 = paVar4->frags + bVar7;
          plVar6->len = 0;
          plVar6->nfrag = '\0';
          plVar6->flags = '\x02';
          paVar4->hdr_token_idx = hdr_token_idx;
          bVar2 = paVar4->frag_index[uVar5];
          if (paVar4->frag_index[uVar5] == 0) {
            paVar4->frag_index[uVar5] = bVar7;
            iVar8 = 0;
          }
          else {
            do {
              bVar9 = bVar2;
              bVar2 = paVar4->frags[bVar9].nfrag;
            } while (bVar2 != 0);
            paVar4->frags[bVar9].nfrag = bVar7;
            iVar8 = 0;
            if (hdr_token_idx == 0x1a) {
              paVar4->pos = uVar3 + 1;
              paVar4->data[uVar3] = ';';
              puVar1 = &paVar4->frags[paVar4->nfrag].len;
              *puVar1 = *puVar1 + 1;
            }
          }
        }
      }
      else {
        iVar8 = 1;
        _lws_log(1,"%s: frag index %d too big\n","lws_frag_start");
      }
    }
  }
  return iVar8;
}

Assistant:

static int lws_frag_start(struct lws *wsi, int hdr_token_idx)
{
	struct allocated_headers *ah = wsi->http.ah;

	if (!ah) {
		lwsl_notice("%s: no ah\n", __func__);
		return 1;
	}

	ah->hdr_token_idx = -1;

	lwsl_header("%s: token %d ah->pos = %d, ah->nfrag = %d\n",
		   __func__, hdr_token_idx, ah->pos, ah->nfrag);

	if (!hdr_token_idx) {
		lwsl_err("%s: zero hdr_token_idx\n", __func__);
		return 1;
	}

	if (ah->nfrag >= LWS_ARRAY_SIZE(ah->frag_index)) {
		lwsl_err("%s: frag index %d too big\n", __func__, ah->nfrag);
		return 1;
	}

	if ((hdr_token_idx == WSI_TOKEN_HTTP_COLON_AUTHORITY ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_METHOD ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_PATH ||
	     hdr_token_idx == WSI_TOKEN_COLON_PROTOCOL ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_SCHEME) &&
	     ah->frag_index[hdr_token_idx]) {
		if (!(ah->frags[ah->frag_index[hdr_token_idx]].flags & 1)) {
			lws_h2_goaway(lws_get_network_wsi(wsi),
				      H2_ERR_PROTOCOL_ERROR,
				      "Duplicated pseudoheader");
			return 1;
		}
	}

	if (ah->nfrag == 0)
		ah->nfrag = 1;

	ah->frags[ah->nfrag].offset = ah->pos;
	ah->frags[ah->nfrag].len = 0;
	ah->frags[ah->nfrag].nfrag = 0;
	ah->frags[ah->nfrag].flags = 2; /* we had reason to set it */

	ah->hdr_token_idx = hdr_token_idx;

	/*
	 * Okay, but we could be, eg, the second or subsequent cookie: header
	 */

	if (ah->frag_index[hdr_token_idx]) {
		int n;

		/* find the last fragment for this header... */
		n = ah->frag_index[hdr_token_idx];
		while (ah->frags[n].nfrag)
			n = ah->frags[n].nfrag;
		/* and point it to continue in our continuation fragment */
		ah->frags[n].nfrag = ah->nfrag;

		/* cookie continuations need a separator token of ';' */
		if (hdr_token_idx == WSI_TOKEN_HTTP_COOKIE) {
			ah->data[ah->pos++] = ';';
			ah->frags[ah->nfrag].len++;
		}
	} else
		ah->frag_index[hdr_token_idx] = ah->nfrag;

	return 0;
}